

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat.h
# Opt level: O0

int __thiscall
wasm::Flat::verifyFlatness::VerifyFlatness::verify
          (VerifyFlatness *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  Fatal *pFVar1;
  Function *arg;
  char local_1b5 [13];
  Fatal local_1a8;
  uchar *local_20;
  char *message_local;
  VerifyFlatness *pVStack_10;
  bool condition_local;
  VerifyFlatness *this_local;
  
  message_local._7_1_ = (byte)ctx & 1;
  if (((ulong)ctx & 1) == 0) {
    local_20 = sig;
    pVStack_10 = this;
    Fatal::Fatal(&local_1a8);
    pFVar1 = Fatal::operator<<(&local_1a8,
                               (char (*) [44])"IR must be flat: run --flatten beforehand (");
    pFVar1 = Fatal::operator<<(pFVar1,(char **)&local_20);
    pFVar1 = Fatal::operator<<(pFVar1,(char (*) [6])", in ");
    arg = Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::getFunction
                    ((Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>
                      *)this);
    pFVar1 = Fatal::operator<<(pFVar1,(Name *)arg);
    local_1b5[0] = ')';
    Fatal::operator<<(pFVar1,local_1b5);
    Fatal::~Fatal(&local_1a8);
  }
  return (int)this;
}

Assistant:

void verify(bool condition, const char* message) {
      if (!condition) {
        Fatal() << "IR must be flat: run --flatten beforehand (" << message
                << ", in " << getFunction()->name << ')';
      }
    }